

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

void __thiscall
ot::commissioner::TokenManager::RequestToken
          (TokenManager *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  ConnectHandler local_70;
  undefined1 local_50 [8];
  anon_class_40_2_1bbb15e4 onConnected;
  uint16_t aPort_local;
  string *aAddr_local;
  Handler<ByteArray> *aHandler_local;
  TokenManager *this_local;
  
  local_50 = (undefined1  [8])this;
  onConnected.aHandler._M_invoker._6_2_ = aPort;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&onConnected,aHandler);
  std::function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)>::
  function<ot::commissioner::TokenManager::RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::__0&,void>
            ((function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)> *)&local_70,
             (anon_class_40_2_1bbb15e4 *)local_50);
  coap::CoapSecure::Connect
            (&this->mRegistrarClient,&local_70,aAddr,onConnected.aHandler._M_invoker._6_2_);
  std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
            (&local_70);
  RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::~__0((__0 *)local_50);
  return;
}

Assistant:

void TokenManager::RequestToken(Commissioner::Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [this, aHandler](const DtlsSession &, Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            SendTokenRequest(aHandler);
        }
    };

    mRegistrarClient.Connect(onConnected, aAddr, aPort);
}